

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O2

float __thiscall ncnn::ObjectBox::box_intersection(ObjectBox *this,ObjectBox *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  
  uVar1 = this->xmin;
  uVar5 = this->ymin;
  auVar14._4_4_ = uVar5;
  auVar14._0_4_ = uVar1;
  auVar14._8_8_ = 0;
  uVar2 = this->xmax;
  uVar6 = this->ymax;
  auVar11._4_4_ = uVar6;
  auVar11._0_4_ = uVar2;
  uVar3 = other->xmin;
  uVar7 = other->ymin;
  auVar13._4_4_ = uVar7;
  auVar13._0_4_ = uVar3;
  auVar13._8_8_ = 0;
  auVar14 = maxps(auVar13,auVar14);
  uVar4 = other->xmax;
  uVar8 = other->ymax;
  auVar10._4_4_ = uVar8;
  auVar10._0_4_ = uVar4;
  auVar10._8_8_ = 0;
  auVar11._8_8_ = 0;
  auVar11 = minps(auVar10,auVar11);
  fVar9 = auVar11._0_4_ - auVar14._0_4_;
  fVar12 = auVar11._4_4_ - auVar14._4_4_;
  fVar15 = 0.0;
  if (0.0 <= fVar12) {
    fVar15 = fVar12 * fVar9;
  }
  return (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar15);
}

Assistant:

float ObjectBox::box_intersection(const ObjectBox &other) const
{
    float intersection_w = box_overlap(xmin, xmax, other.xmin, other.xmax);
    float intersection_h = box_overlap(ymin, ymax, other.ymin, other.ymax);
    if (intersection_w < 0 || intersection_h < 0)
        return 0;
    float area = intersection_w * intersection_h;
    return area;
}